

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

ON_Quaternion * __thiscall
ON_Quaternion::operator*(ON_Quaternion *__return_storage_ptr__,ON_Quaternion *this,ON_Quaternion *q)

{
  ON_Quaternion *q_local;
  ON_Quaternion *this_local;
  
  ON_Quaternion(__return_storage_ptr__,
                -this->d * q->d + -this->c * q->c + this->a * q->a + -(this->b * q->b),
                -this->d * q->c + this->c * q->d + this->a * q->b + this->b * q->a,
                this->d * q->b + this->c * q->a + this->a * q->c + -(this->b * q->d),
                this->d * q->a + -this->c * q->b + this->a * q->d + this->b * q->c);
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion  ON_Quaternion::operator*(const ON_Quaternion& q) const
{
  return ON_Quaternion(a*q.a - b*q.b - c*q.c - d*q.d,
                       a*q.b + b*q.a + c*q.d - d*q.c,
                       a*q.c - b*q.d + c*q.a + d*q.b,
                       a*q.d + b*q.c - c*q.b + d*q.a);
}